

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi_dp.c
# Opt level: O2

void MpiProvideWriterDataToReader
               (CP_Services Svcs,DP_RS_Stream RS_Stream_v,int writerCohortSize,
               CP_PeerCohort PeerCohort,void **providedWriterInfo_v)

{
  void *pvVar1;
  long lVar2;
  ulong uVar3;
  undefined8 *puVar4;
  undefined8 *puVar5;
  ulong uVar6;
  ulong uVar7;
  byte bVar8;
  
  bVar8 = 0;
  *(CP_PeerCohort *)((long)RS_Stream_v + 0x20) = PeerCohort;
  *(int *)((long)RS_Stream_v + 0x18) = writerCohortSize;
  pvVar1 = malloc((long)writerCohortSize * 0x50);
  *(void **)((long)RS_Stream_v + 0x80) = pvVar1;
  pvVar1 = malloc((long)writerCohortSize * 8);
  uVar3 = 0;
  uVar7 = (ulong)(uint)writerCohortSize;
  if (writerCohortSize < 1) {
    uVar7 = uVar3;
  }
  *(void **)((long)RS_Stream_v + 0x88) = pvVar1;
  for (uVar6 = 0; uVar7 != uVar6; uVar6 = uVar6 + 1) {
    puVar4 = (undefined8 *)providedWriterInfo_v[uVar6];
    puVar5 = (undefined8 *)(*(long *)((long)RS_Stream_v + 0x80) + uVar3);
    for (lVar2 = 10; lVar2 != 0; lVar2 = lVar2 + -1) {
      *puVar5 = *puVar4;
      puVar4 = puVar4 + (ulong)bVar8 * -2 + 1;
      puVar5 = puVar5 + (ulong)bVar8 * -2 + 1;
    }
    *(undefined **)(*(long *)((long)RS_Stream_v + 0x88) + uVar6 * 8) = &ompi_mpi_comm_null;
    uVar3 = uVar3 + 0x50;
  }
  return;
}

Assistant:

static void MpiProvideWriterDataToReader(CP_Services Svcs, DP_RS_Stream RS_Stream_v,
                                         int writerCohortSize, CP_PeerCohort PeerCohort,
                                         void **providedWriterInfo_v)
{
    MpiStreamRD StreamRS = (MpiStreamRD)RS_Stream_v;
    MpiWriterContactInfo *providedWriterInfo = (MpiWriterContactInfo *)providedWriterInfo_v;

    StreamRS->Link.PeerCohort = PeerCohort;
    StreamRS->Link.CohortSize = writerCohortSize;

    /* * Copy of writer contact information (original will not be preserved) */
    StreamRS->CohortWriterInfo = malloc(sizeof(struct _MpiWriterContactInfo) * writerCohortSize);
    StreamRS->CohortMpiComms = malloc(sizeof(MPI_Comm) * writerCohortSize);
    for (int i = 0; i < writerCohortSize; i++)
    {
        memcpy(&StreamRS->CohortWriterInfo[i], providedWriterInfo[i],
               sizeof(struct _MpiWriterContactInfo));
        StreamRS->CohortMpiComms[i] = MPI_COMM_NULL;
    }
}